

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void * anon_unknown.dwarf_280db::checking_global_allocfunc
                 (upb_alloc *alloc,void *ptr,size_t oldsize,size_t size)

{
  unsigned_long *puVar1;
  upb_alloc *local_50;
  void *ret;
  unsigned_long local_40;
  int local_34;
  size_t sStack_30;
  int header_size;
  size_t size_local;
  size_t oldsize_local;
  void *ptr_local;
  upb_alloc *alloc_local;
  
  local_40 = 0x10;
  ret = (void *)0x4;
  sStack_30 = size;
  size_local = oldsize;
  oldsize_local = (size_t)ptr;
  ptr_local = alloc;
  puVar1 = std::max<unsigned_long>(&local_40,(unsigned_long *)&ret);
  local_34 = (int)*puVar1;
  if ((oldsize_local != 0) &&
     (oldsize_local = oldsize_local + (long)-local_34, *(int *)oldsize_local != 0x5afe)) {
    __assert_fail("*reinterpret_cast<int*>(ptr) == 0x5AFE",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
                  ,0x1e9,
                  "void *(anonymous namespace)::checking_global_allocfunc(upb_alloc *, void *, size_t, size_t)"
                 );
  }
  if (sStack_30 == 0) {
    free((void *)oldsize_local);
    alloc_local = (upb_alloc *)0x0;
  }
  else {
    if (size_local == 0) {
      local_50 = (upb_alloc *)malloc(sStack_30 + (long)local_34);
    }
    else {
      local_50 = (upb_alloc *)realloc((void *)oldsize_local,sStack_30 + (long)local_34);
    }
    if (local_50 == (upb_alloc *)0x0) {
      alloc_local = local_50;
    }
    else {
      *(undefined4 *)&local_50->func = 0x5afe;
      alloc_local = (upb_alloc *)((long)&local_50->func + (long)local_34);
    }
  }
  return alloc_local;
}

Assistant:

static void* checking_global_allocfunc(upb_alloc* alloc, void* ptr,
                                       size_t oldsize, size_t size) {
  int header_size = std::max(alignof(max_align_t), sizeof(int));
  if (ptr) {
    ptr = UPB_PTR_AT(ptr, -header_size, void);
    UPB_ASSERT(*reinterpret_cast<int*>(ptr) == 0x5AFE);
  }
  if (size == 0) {
    free(ptr);
    return nullptr;
  }
  void* ret;
  if (oldsize == 0) {
    ret = malloc(size + header_size);
  } else {
    ret = realloc(ptr, size + header_size);
  }
  if (ret) {
    *reinterpret_cast<int*>(ret) = 0x5AFE;
    return UPB_PTR_AT(ret, header_size, void);
  }
  return ret;
}